

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O3

void __thiscall FArchive::WriteCount(FArchive *this,DWORD count)

{
  bool bVar1;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  do {
    uStack_28 = CONCAT17((0x7f < count) << 7 | (byte)count & 0x7f,(undefined7)uStack_28);
    (*this->_vptr_FArchive[2])(this,(long)&uStack_28 + 7,1);
    bVar1 = 0x7f < count;
    count = count >> 7;
  } while (bVar1);
  return;
}

Assistant:

void FArchive::WriteCount (DWORD count)
{
	BYTE out;

	do
	{
		out = count & 0x7f;
		if (count >= 0x80)
			out |= 0x80;
		Write (&out, sizeof(BYTE));
		count >>= 7;
	} while (count);

}